

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_> * __thiscall
MPL::detail::ModelPackageImpl::findItemsByAuthor
          (vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>
           *__return_storage_ptr__,ModelPackageImpl *this,string *author)

{
  bool bVar1;
  __type _Var2;
  pointer this_00;
  element_type *peVar3;
  string *__lhs;
  undefined1 local_88 [8];
  shared_ptr<MPL::ModelPackageItemInfo> itemInfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *identifier;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  identifiers;
  undefined1 local_30 [8];
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntries;
  string *author_local;
  ModelPackageImpl *this_local;
  vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_> *itemInfoVector;
  
  itemInfoEntries._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
  super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
  super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl._7_1_ = 0;
  (__return_storage_ptr__->
  super__Vector_base<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>::vector
            (__return_storage_ptr__);
  getItemInfoEntries((ModelPackageImpl *)local_30);
  bVar1 = std::operator!=((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_30,
                          (nullptr_t)0x0);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    this_00 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                        ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_30);
    JsonMap::getKeys(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    identifier = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&identifier), bVar1) {
      itemInfo.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      findItem((ModelPackageImpl *)local_88,(string *)this);
      peVar3 = std::
               __shared_ptr_access<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_88);
      __lhs = ModelPackageItemInfo::author_abi_cxx11_(peVar3);
      _Var2 = std::operator==(__lhs,author);
      if (_Var2) {
        peVar3 = std::
                 __shared_ptr_access<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_88);
        std::vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>::
        push_back(__return_storage_ptr__,peVar3);
      }
      std::shared_ptr<MPL::ModelPackageItemInfo>::~shared_ptr
                ((shared_ptr<MPL::ModelPackageItemInfo> *)local_88);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
  }
  itemInfoEntries._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
  super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
  super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl._7_1_ = 1;
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_30);
  if ((itemInfoEntries._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
       super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
       super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl._7_1_ & 1) == 0) {
    std::vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ModelPackageItemInfo> ModelPackageImpl::findItemsByAuthor(const std::string& author) const
{
    auto itemInfoVector = std::vector<ModelPackageItemInfo>();
    auto itemInfoEntries = getItemInfoEntries();
    if (itemInfoEntries != nullptr) {
        std::vector<std::string> identifiers;
        itemInfoEntries->getKeys(identifiers);
        for (const auto& identifier : identifiers) {
            auto itemInfo = findItem(identifier);
        	if (itemInfo->author() == author) {
	            itemInfoVector.push_back(*itemInfo);
	        }
        }
    }
    
    return itemInfoVector;
}